

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_cf_string_dump(lua_State *L)

{
  int iVar1;
  GCfunc *pGVar2;
  lua_State *in_RDI;
  luaL_Buffer b;
  int strip;
  GCfunc *fn;
  ErrMsg in_stack_ffffffffffffdfcc;
  ErrMsg em;
  lua_State *in_stack_ffffffffffffdfd0;
  int in_stack_ffffffffffffe00c;
  void *in_stack_ffffffffffffe010;
  lua_Writer in_stack_ffffffffffffe018;
  GCproto *in_stack_ffffffffffffe020;
  lua_State *in_stack_ffffffffffffe028;
  
  pGVar2 = lj_lib_checkfunc(in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfcc);
  em = in_stack_ffffffffffffdfcc & 0xffffff;
  if (in_RDI->base + 1 < in_RDI->top) {
    em = CONCAT13(*(uint *)((long)in_RDI->base + 0xc) < 0xfffffffe,(int3)in_stack_ffffffffffffdfcc);
  }
  in_RDI->top = in_RDI->base + 1;
  luaL_buffinit(in_RDI,(luaL_Buffer *)&stack0xffffffffffffdfd0);
  if ((pGVar2->c).ffid == '\0') {
    iVar1 = lj_bcwrite(in_stack_ffffffffffffe028,in_stack_ffffffffffffe020,in_stack_ffffffffffffe018
                       ,in_stack_ffffffffffffe010,in_stack_ffffffffffffe00c);
    if (iVar1 == 0) {
      luaL_pushresult((luaL_Buffer *)0x188fc6);
      return 1;
    }
  }
  lj_err_caller(in_stack_ffffffffffffdfd0,em);
}

Assistant:

LJLIB_CF(string_dump)
{
  GCfunc *fn = lj_lib_checkfunc(L, 1);
  int strip = L->base+1 < L->top && tvistruecond(L->base+1);
  luaL_Buffer b;
  L->top = L->base+1;
  luaL_buffinit(L, &b);
  if (!isluafunc(fn) || lj_bcwrite(L, funcproto(fn), writer_buf, &b, strip))
    lj_err_caller(L, LJ_ERR_STRDUMP);
  luaL_pushresult(&b);
  return 1;
}